

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdataurl.cpp
# Opt level: O0

bool qDecodeDataUrl(QUrl *uri,QString *mimeType,QByteArray *payload)

{
  QByteArrayView s;
  QByteArrayView s_00;
  QByteArrayView s_01;
  Base64Options options;
  QLatin1StringView s_02;
  QLatin1StringView s_03;
  bool bVar1;
  char *__file;
  qsizetype n;
  char *in_RDX;
  __off_t __length;
  long in_FS_OFFSET;
  qsizetype i;
  qsizetype pos;
  char16_t *str;
  QLatin1StringView charset;
  QLatin1StringView textPlain;
  QLatin1StringView base64;
  QByteArrayView data;
  QByteArray dataArray;
  undefined4 in_stack_fffffffffffffcf8;
  Base64Option in_stack_fffffffffffffcfc;
  ComponentFormattingOption in_stack_fffffffffffffd00;
  undefined4 in_stack_fffffffffffffd04;
  undefined4 in_stack_fffffffffffffd08;
  FormattingOptions in_stack_fffffffffffffd0c;
  QByteArrayView *in_stack_fffffffffffffd10;
  undefined4 in_stack_fffffffffffffd18;
  undefined2 in_stack_fffffffffffffd1c;
  char in_stack_fffffffffffffd1e;
  char in_stack_fffffffffffffd1f;
  undefined1 *in_stack_fffffffffffffd20;
  char *in_stack_fffffffffffffd28;
  QUrl *in_stack_fffffffffffffd38;
  QFlagsStorage<QUrl::ComponentFormattingOption> in_stack_fffffffffffffd6c;
  byte local_281;
  bool local_229;
  undefined1 local_210 [64];
  QLatin1StringView local_1d0;
  qsizetype local_1c0;
  char *local_1b8;
  undefined1 *local_1b0;
  storage_type *local_1a8;
  QLatin1String local_190;
  QLatin1String local_180;
  undefined1 local_168 [24];
  qsizetype local_150;
  char *local_148;
  undefined1 *local_140;
  storage_type *local_138;
  QLatin1String local_120;
  QByteArrayView local_110;
  QByteArrayView local_100;
  QByteArrayView local_d8 [4];
  undefined1 *local_98;
  undefined1 *puStack_90;
  undefined1 *local_88;
  QArrayDataPointer<char16_t> local_80 [3];
  QLatin1StringView local_30;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QUrl::scheme((QUrl *)CONCAT44(in_stack_fffffffffffffd0c.i,in_stack_fffffffffffffd08));
  local_30 = Qt::Literals::StringLiterals::operator____L1
                       ((char *)CONCAT44(in_stack_fffffffffffffd0c.i,in_stack_fffffffffffffd08),
                        CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
  bVar1 = operator!=((QString *)CONCAT44(in_stack_fffffffffffffd0c.i,in_stack_fffffffffffffd08),
                     (QLatin1StringView *)
                     CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
  local_281 = 1;
  if (!bVar1) {
    QFlags<QUrl::ComponentFormattingOption>::QFlags
              ((QFlags<QUrl::ComponentFormattingOption> *)
               CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
               in_stack_fffffffffffffcfc);
    QUrl::host(in_stack_fffffffffffffd38,(ComponentFormattingOptions)in_stack_fffffffffffffd6c.i);
    bVar1 = QString::isEmpty((QString *)0x275f56);
    local_281 = bVar1 ^ 0xff;
    QString::~QString((QString *)0x275f83);
  }
  QString::~QString((QString *)0x275f90);
  if ((local_281 & 1) == 0) {
    QArrayDataPointer<char16_t>::QArrayDataPointer
              (local_80,(Data *)0x0,L"text/plain;charset=US-ASCII",0x1b);
    QString::QString((QString *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                     (DataPointer *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
    QString::operator=((QString *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                       (QString *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
    QString::~QString((QString *)0x276053);
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)
               CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
    local_88 = &DAT_aaaaaaaaaaaaaaaa;
    local_98 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
    operator|(in_stack_fffffffffffffd00,in_stack_fffffffffffffcfc);
    QUrl::url((QUrl *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8),
              in_stack_fffffffffffffd0c);
    QString::toLatin1((QString *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
    QByteArray::fromPercentEncoding
              ((QByteArray *)CONCAT44(in_stack_fffffffffffffd0c.i,in_stack_fffffffffffffd08),
               (char)((uint)in_stack_fffffffffffffd04 >> 0x18));
    QByteArray::~QByteArray((QByteArray *)0x2760ff);
    QString::~QString((QString *)0x27610c);
    local_d8[0].m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_d8[0].m_data = &DAT_aaaaaaaaaaaaaaaa;
    QByteArrayView::QByteArrayView<QByteArray,_true>
              (in_stack_fffffffffffffd10,
               (QByteArray *)CONCAT44(in_stack_fffffffffffffd0c.i,in_stack_fffffffffffffd08));
    __file = (char *)QByteArrayView::indexOf
                               ((QByteArrayView *)
                                CONCAT44(in_stack_fffffffffffffd0c.i,in_stack_fffffffffffffd08),
                                (char)((uint)in_stack_fffffffffffffd04 >> 0x18),
                                CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
    if (__file != (char *)0xffffffffffffffff) {
      local_100 = QByteArrayView::mid((QByteArrayView *)
                                      CONCAT17(in_stack_fffffffffffffd1f,
                                               CONCAT16(in_stack_fffffffffffffd1e,
                                                        CONCAT24(in_stack_fffffffffffffd1c,
                                                                 in_stack_fffffffffffffd18))),
                                      (qsizetype)in_stack_fffffffffffffd28,
                                      (qsizetype)in_stack_fffffffffffffd20);
      QByteArrayView::toByteArray
                ((QByteArrayView *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
      QByteArray::operator=
                ((QByteArray *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                 (QByteArray *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      QByteArray::~QByteArray((QByteArray *)0x2761ec);
      QByteArrayView::truncate(local_d8,__file,__length);
      local_110 = QByteArrayView::trimmed
                            ((QByteArrayView *)
                             CONCAT44(in_stack_fffffffffffffd0c.i,in_stack_fffffffffffffd08));
      local_d8[0].m_size = local_110.m_size;
      local_d8[0].m_data = local_110.m_data;
      local_120.m_size = 7;
      local_120.m_data = ";base64";
      local_140 = (undefined1 *)local_110.m_size;
      local_138 = local_110.m_data;
      s.m_data._0_4_ = in_stack_fffffffffffffd18;
      s.m_size = (qsizetype)in_stack_fffffffffffffd10;
      s.m_data._4_2_ = in_stack_fffffffffffffd1c;
      s.m_data._6_1_ = in_stack_fffffffffffffd1e;
      s.m_data._7_1_ = in_stack_fffffffffffffd1f;
      QLatin1String::QLatin1String
                ((QLatin1String *)CONCAT44(in_stack_fffffffffffffd0c.i,in_stack_fffffffffffffd08),s)
      ;
      local_150 = local_120.m_size;
      local_148 = local_120.m_data;
      s_02.m_data = in_stack_fffffffffffffd28;
      s_02.m_size = (qsizetype)in_stack_fffffffffffffd20;
      bVar1 = QLatin1String::endsWith
                        ((QLatin1String *)
                         CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8),s_02,
                         CaseInsensitive);
      if (bVar1) {
        QFlags<QByteArray::Base64Option>::QFlags
                  ((QFlags<QByteArray::Base64Option> *)
                   CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                   in_stack_fffffffffffffcfc);
        options.super_QFlagsStorageHelper<QByteArray::Base64Option,_4>.
        super_QFlagsStorage<QByteArray::Base64Option>.i._2_1_ = in_stack_fffffffffffffd1e;
        options.super_QFlagsStorageHelper<QByteArray::Base64Option,_4>.
        super_QFlagsStorage<QByteArray::Base64Option>.i._0_2_ = in_stack_fffffffffffffd1c;
        options.super_QFlagsStorageHelper<QByteArray::Base64Option,_4>.
        super_QFlagsStorage<QByteArray::Base64Option>.i._3_1_ = in_stack_fffffffffffffd1f;
        QByteArray::fromBase64
                  ((QByteArray *)CONCAT44(in_stack_fffffffffffffd0c.i,in_stack_fffffffffffffd08),
                   options);
        in_stack_fffffffffffffd20 = local_168;
        QByteArray::operator=
                  ((QByteArray *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                   (QByteArray *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
        QByteArray::~QByteArray((QByteArray *)0x27633e);
        n = QLatin1String::size(&local_120);
        QByteArrayView::chop(local_d8,n);
        in_stack_fffffffffffffd28 = in_RDX;
      }
      local_180.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_180.m_data = &DAT_aaaaaaaaaaaaaaaa;
      QLatin1String::QLatin1String(&local_180);
      local_190.m_size = 7;
      local_190.m_data = "charset";
      local_1b0 = (undefined1 *)local_d8[0].m_size;
      local_1a8 = local_d8[0].m_data;
      s_00.m_data._0_4_ = in_stack_fffffffffffffd18;
      s_00.m_size = (qsizetype)in_stack_fffffffffffffd10;
      s_00.m_data._4_2_ = in_stack_fffffffffffffd1c;
      s_00.m_data._6_1_ = in_stack_fffffffffffffd1e;
      s_00.m_data._7_1_ = in_stack_fffffffffffffd1f;
      QLatin1String::QLatin1String
                ((QLatin1String *)CONCAT44(in_stack_fffffffffffffd0c.i,in_stack_fffffffffffffd08),
                 s_00);
      local_1c0 = local_190.m_size;
      local_1b8 = local_190.m_data;
      s_03.m_data = in_stack_fffffffffffffd28;
      s_03.m_size = (qsizetype)in_stack_fffffffffffffd20;
      bVar1 = QLatin1String::startsWith
                        ((QLatin1String *)
                         CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8),s_03,
                         CaseInsensitive);
      if (bVar1) {
        QLatin1String::size(&local_190);
        do {
          in_stack_fffffffffffffd1f =
               QByteArrayView::at((QByteArrayView *)
                                  CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                                  CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
        } while (in_stack_fffffffffffffd1f == ' ');
        in_stack_fffffffffffffd1e =
             QByteArrayView::at((QByteArrayView *)
                                CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                                CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
        if (in_stack_fffffffffffffd1e == '=') {
          local_1d0 = Qt::Literals::StringLiterals::operator____L1
                                ((char *)CONCAT44(in_stack_fffffffffffffd0c.i,
                                                  in_stack_fffffffffffffd08),
                                 CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
          local_180.m_size = local_1d0.m_size;
          local_180.m_data = local_1d0.m_data;
        }
      }
      bVar1 = QByteArrayView::isEmpty((QByteArrayView *)0x27659e);
      if (!bVar1) {
        QByteArrayView::trimmed
                  ((QByteArrayView *)CONCAT44(in_stack_fffffffffffffd0c.i,in_stack_fffffffffffffd08)
                  );
        s_01.m_data._0_4_ = in_stack_fffffffffffffd18;
        s_01.m_size = (qsizetype)local_210;
        s_01.m_data._4_2_ = in_stack_fffffffffffffd1c;
        s_01.m_data._6_1_ = in_stack_fffffffffffffd1e;
        s_01.m_data._7_1_ = in_stack_fffffffffffffd1f;
        QLatin1String::QLatin1String
                  ((QLatin1String *)CONCAT44(in_stack_fffffffffffffd0c.i,in_stack_fffffffffffffd08),
                   s_01);
        operator+((QLatin1String *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                  (QLatin1String *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
        QStringBuilder::operator_cast_to_QString
                  ((QStringBuilder<QLatin1String_&,_QLatin1String> *)
                   CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
        QString::operator=((QString *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                           (QString *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8))
        ;
        QString::~QString((QString *)0x27663a);
      }
    }
    local_229 = true;
    QByteArray::~QByteArray((QByteArray *)0x276651);
  }
  else {
    local_229 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_229;
  }
  __stack_chk_fail();
}

Assistant:

Q_CORE_EXPORT bool qDecodeDataUrl(const QUrl &uri, QString &mimeType, QByteArray &payload)
{
    if (uri.scheme() != "data"_L1 || !uri.host().isEmpty())
        return false;

    mimeType = QStringLiteral("text/plain;charset=US-ASCII");

    // the following would have been the correct thing, but
    // reality often differs from the specification. People have
    // data: URIs with ? and #
    //QByteArray data = QByteArray::fromPercentEncoding(uri.path(QUrl::FullyEncoded).toLatin1());
    const QByteArray dataArray =
            QByteArray::fromPercentEncoding(uri.url(QUrl::FullyEncoded | QUrl::RemoveScheme).toLatin1());
    QByteArrayView data = dataArray;

    // parse it:
    const qsizetype pos = data.indexOf(',');
    if (pos != -1) {
        payload = data.mid(pos + 1).toByteArray();
        data.truncate(pos);
        data = data.trimmed();

        // find out if the payload is encoded in Base64
        constexpr auto base64 = ";base64"_L1;
        if (QLatin1StringView{data}.endsWith(base64, Qt::CaseInsensitive)) {
            payload = QByteArray::fromBase64(payload);
            data.chop(base64.size());
        }

        QLatin1StringView textPlain;
        constexpr auto charset = "charset"_L1;
        if (QLatin1StringView{data}.startsWith(charset, Qt::CaseInsensitive)) {
            qsizetype i = charset.size();
            while (data.at(i) == ' ')
                ++i;
            if (data.at(i) == '=')
                textPlain = "text/plain;"_L1;
        }

        if (!data.isEmpty())
            mimeType = textPlain + QLatin1StringView(data.trimmed());
    }

    return true;
}